

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_kernel.h
# Opt level: O0

void __thiscall
dlib::
array<dlib::member_function_pointer<void,_void,_void,_void>,_dlib::memory_manager_stateless_kernel_1<char>_>
::swap(array<dlib::member_function_pointer<void,_void,_void,_void>,_dlib::memory_manager_stateless_kernel_1<char>_>
       *this,array<dlib::member_function_pointer<void,_void,_void,_void>,_dlib::memory_manager_stateless_kernel_1<char>_>
             *item)

{
  member_function_pointer<void,_void,_void,_void> *pmVar1;
  member_function_pointer<void,_void,_void,_void> *pmVar2;
  member_function_pointer<void,_void,_void,_void> *pmVar3;
  long in_RSI;
  member_function_pointer<void,_void,_void,_void> **in_RDI;
  member_function_pointer<void,_void,_void,_void> *array_elements_temp;
  unsigned_long max_array_size_temp;
  unsigned_long array_size_temp;
  member_function_pointer<void,_void,_void,_void> **in_stack_ffffffffffffffc8;
  
  pmVar1 = *(member_function_pointer<void,_void,_void,_void> **)(in_RSI + 0x10);
  pmVar2 = *(member_function_pointer<void,_void,_void,_void> **)(in_RSI + 0x18);
  pmVar3 = *(member_function_pointer<void,_void,_void,_void> **)(in_RSI + 0x20);
  *(member_function_pointer<void,_void,_void,_void> **)(in_RSI + 0x10) = in_RDI[2];
  *(member_function_pointer<void,_void,_void,_void> **)(in_RSI + 0x18) = in_RDI[3];
  *(member_function_pointer<void,_void,_void,_void> **)(in_RSI + 0x20) = in_RDI[4];
  in_RDI[2] = pmVar1;
  in_RDI[3] = pmVar2;
  in_RDI[4] = pmVar3;
  exchange<bool>((bool *)in_RDI,(bool *)in_stack_ffffffffffffffc8);
  exchange<dlib::member_function_pointer<void,void,void,void>*>(in_RDI,in_stack_ffffffffffffffc8);
  exchange<dlib::member_function_pointer<void,void,void,void>*>(in_RDI,in_stack_ffffffffffffffc8);
  memory_manager_stateless_kernel_1<dlib::member_function_pointer<void,_void,_void,_void>_>::swap
            ((memory_manager_stateless_kernel_1<dlib::member_function_pointer<void,_void,_void,_void>_>
              *)(in_RDI + 1),
             (memory_manager_stateless_kernel_1<dlib::member_function_pointer<void,_void,_void,_void>_>
              *)(in_RSI + 8));
  return;
}

Assistant:

void array<T,mem_manager>::
    swap (
        array<T,mem_manager>& item
    )
    {
        unsigned long    array_size_temp        = item.array_size;
        unsigned long    max_array_size_temp    = item.max_array_size;
        T*               array_elements_temp    = item.array_elements;

        item.array_size         = array_size;
        item.max_array_size     = max_array_size;
        item.array_elements     = array_elements;

        array_size        = array_size_temp;
        max_array_size    = max_array_size_temp;
        array_elements    = array_elements_temp;

        exchange(_at_start,item._at_start);
        exchange(pos,item.pos);
        exchange(last_pos,item.last_pos);
        pool.swap(item.pool);
    }